

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  JointType JVar1;
  pointer pFVar2;
  pointer pJVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pJVar6;
  pointer puVar7;
  Body *pBVar8;
  bool bVar9;
  reference this_00;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  pair<RigidBodyDynamics::JointType,_unsigned_int> *ppVar13;
  iterator __position;
  ostream *poVar14;
  RBDLError *pRVar15;
  Joint *joint_00;
  int iVar16;
  uint i_1;
  string *psVar17;
  uint i;
  uint uVar18;
  uint uVar19;
  uint movable_parent_id;
  Body *local_300;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_2f8;
  string *local_2f0;
  vector<RigidBodyDynamics::Joint,_std::allocator<RigidBodyDynamics::Joint>_> *local_2e8;
  SpatialTransform *local_2e0;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  SpatialRigidBodyInertia rbi;
  SpatialTransform movable_parent_transform;
  
  JVar1 = joint->mJointType;
  local_300 = body;
  if (JVar1 < (JointType6DoF|JointTypePrismatic)) {
    joint_00 = (Joint *)0x204ffe;
    if ((0x204ffeU >> (JVar1 & (JointType2DoF|JointType1DoF)) & 1) != 0) {
      movable_parent_id = parent_id;
      local_2f0 = body_name;
      Math::SpatialTransform::SpatialTransform(&movable_parent_transform);
      bVar9 = IsFixedBodyId(this,parent_id);
      if (bVar9) {
        uVar18 = parent_id - this->fixed_body_discriminator;
        pFVar2 = (this->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        movable_parent_id = pFVar2[uVar18].mMovableParent;
        Math::SpatialTransform::operator=
                  (&movable_parent_transform,&pFVar2[uVar18].mParentTransform);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->lambda,&movable_parent_id);
      pJVar3 = (this->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = pJVar3[-1].q_index;
      if (pJVar3[-1].mDoFCount == 0) {
        if (pJVar3[-1].mJointType != JointTypeCustom) goto LAB_00245073;
      }
      else if (pJVar3[-1].mJointType != JointTypeCustom) {
        uVar18 = pJVar3[-1].mDoFCount + uVar18;
        goto LAB_00245073;
      }
      uVar18 = uVar18 + *(int *)((this->mCustomJoints).
                                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1] + 8);
LAB_00245073:
      local_2e8 = &this->mJoints;
      local_2e0 = joint_frame;
      for (uVar19 = 0; uVar19 < joint->mDoFCount; uVar19 = uVar19 + 1) {
        joint_types.
        super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(joint_types.
                               super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar19 + uVar18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->lambda_q,(uint *)&joint_types);
      }
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&this->mu,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&joint_types);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&joint_types);
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::at(&this->mu,(ulong)movable_parent_id);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(joint_types.
                             super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)(((long)(this->mBodies).
                                          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                          .
                                          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->mBodies).
                                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                         .
                                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x70));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_00,(uint *)&joint_types);
      Math::SpatialTransform::SpatialTransform((SpatialTransform *)&joint_types);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_lambda).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&joint_types);
      Math::SpatialTransform::SpatialTransform((SpatialTransform *)&joint_types);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&joint_types);
      pBVar8 = local_300;
      std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
      push_back(&(this->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ,local_300);
      psVar17 = local_2f0;
      if (local_2f0->_M_string_length != 0) {
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mBodyNameMap)._M_t,local_2f0);
        if ((_Rb_tree_header *)iVar10._M_node !=
            &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&joint_types);
          poVar14 = std::operator<<((ostream *)&joint_types,"Error: Body with name \'");
          poVar14 = std::operator<<(poVar14,(string *)local_2f0);
          poVar14 = std::operator<<(poVar14,"\' already exists!");
          std::endl<char,std::char_traits<char>>(poVar14);
          pRVar15 = (RBDLError *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          Errors::RBDLError::RBDLError(pRVar15,&local_140);
          __cxa_throw(pRVar15,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
        }
        pBVar4 = (this->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar5 = (this->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](&this->mBodyNameMap,psVar17);
        *pmVar11 = (int)(((long)pBVar4 - (long)pBVar5) / 0x70) - 1;
      }
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      uVar18 = (int)(((long)(this->mJoints).
                            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mJoints).
                           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 1;
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      push_back(&local_2e8->
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ,joint);
      pJVar3 = (this->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->mJoints).
      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>.
      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].q_index =
           pJVar3[uVar18].mDoFCount + pJVar3[uVar18].q_index;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
                (&(this->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 joint->mJointAxes);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
                (&(this->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 joint->mJointAxes);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->c_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
                ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)&joint_types,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  *)&rbi);
      std::
      vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
      ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
                ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                  *)&this->multdof3_S,(Matrix<double,_6,_3,_0,_6,_3> *)&joint_types);
      rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
                ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)&joint_types,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  *)&rbi);
      std::
      vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
      ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
                ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                  *)&this->multdof3_U,(Matrix<double,_6,_3,_0,_6,_3> *)&joint_types);
      rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&joint_types,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&rbi);
      std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::emplace_back<Matrix3_t>
                (&this->multdof3_Dinv,(Matrix3_t *)&joint_types);
      rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&joint_types,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&rbi);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::emplace_back<Vector3_t>
                (&this->multdof3_u,(Vector3_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)joint_types.
                            super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->multdof3_w_index,(uint *)&joint_types);
      this->dof_count = this->dof_count + joint->mDoFCount;
      pJVar3 = (this->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar6 = (this->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar7 = (this->multdof3_w_index).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = 0;
      for (uVar12 = 1; uVar12 < (ulong)(((long)pJVar6 - (long)pJVar3) / 0x18);
          uVar12 = (ulong)((int)uVar12 + 1)) {
        if (pJVar3[uVar12].mJointType == JointTypeSpherical) {
          puVar7[uVar12] = this->dof_count + iVar16;
          iVar16 = iVar16 + 1;
        }
      }
      this->q_size = iVar16 + this->dof_count;
      this->qdot_size = this->qdot_size + joint->mDoFCount;
      Math::SpatialTransform::operator*
                ((SpatialTransform *)&joint_types,local_2e0,&movable_parent_transform);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_T).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
      _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
                ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&joint_types,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                  *)&rbi);
      std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
      emplace_back<SpatialMatrix_t>
                (&(this->IA).
                  super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>,
                 (SpatialMatrix_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((long)(this->mBodies).
                            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x70);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (&this->d,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((long)(this->mBodies).
                            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x70);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (&this->u,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC
                (&rbi,pBVar8->mMass,&pBVar8->mCenterOfMass,&pBVar8->mInertia);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,&rbi);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,&rbi);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->hc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joint_types.
      super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
      emplace_back<SpatialVector_t>
                (&(this->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
                 (SpatialVector_t *)&joint_types);
      uVar12 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70;
      if (uVar12 != this->fixed_body_discriminator) {
        this->previously_added_body_id = (int)uVar12 - 1;
        puVar7 = (this->mJointUpdateOrder).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar7) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar7;
        }
        joint_types.
        super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        joint_types.
        super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        joint_types.
        super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar12 = 0;
        while( true ) {
          pJVar3 = (this->mJoints).
                   super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->mJoints).
                             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar3) / 0x18) <=
              uVar12) break;
          local_2f8.first = pJVar3[uVar12].mJointType;
          local_2f8.second = (uint)uVar12;
          std::
          vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
          ::emplace_back<std::pair<RigidBodyDynamics::JointType,unsigned_int>>
                    ((vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
                      *)&joint_types,&local_2f8);
          local_2f8.first =
               (local_2e8->
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ).
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].mJointType;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&this->mJointUpdateOrder,&local_2f8.first);
          uVar12 = (ulong)((uint)uVar12 + 1);
        }
        puVar7 = (this->mJointUpdateOrder).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar7) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar7;
        }
        ppVar13 = joint_types.
                  super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        while (ppVar13 !=
               joint_types.
               super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
          JVar1 = (joint_types.
                   super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first;
          __position._M_current =
               joint_types.
               super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          while (__position._M_current != ppVar13) {
            if ((__position._M_current)->first == JVar1) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this->mJointUpdateOrder,&(__position._M_current)->second);
              __position = std::
                           vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                           ::erase(&joint_types,__position._M_current);
              ppVar13 = joint_types.
                        super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              __position._M_current = __position._M_current + 1;
            }
          }
        }
        uVar18 = this->previously_added_body_id;
        std::
        _Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ::~_Vector_base(&joint_types.
                         super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                       );
        return uVar18;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&joint_types);
      poVar14 = std::operator<<((ostream *)&joint_types,"Error: cannot add more than ");
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      poVar14 = std::operator<<(poVar14,
                                " movable bodies. You need to modify Model::fixed_body_discriminator for this."
                               );
      std::endl<char,std::char_traits<char>>(poVar14);
      pRVar15 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      Errors::RBDLError::RBDLError(pRVar15,&local_160);
      __cxa_throw(pRVar15,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    if (JVar1 == JointTypeFixed) {
      std::__cxx11::string::string((string *)&local_100,(string *)body_name);
      uVar18 = AddBodyFixedJoint(this,parent_id,joint_frame,joint_00,local_300,&local_100);
      this->previously_added_body_id = uVar18;
      psVar17 = &local_100;
      goto LAB_00245734;
    }
  }
  std::__cxx11::string::string((string *)&local_120,(string *)body_name);
  uVar18 = AddBodyMultiDofJoint(this,parent_id,joint_frame,joint,local_300,&local_120);
  this->previously_added_body_id = uVar18;
  psVar17 = &local_120;
LAB_00245734:
  std::__cxx11::string::~string((string *)psVar17);
  return this->previously_added_body_id;
}

Assistant:

unsigned int Model::AddBody(
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  assert (lambda.size() > 0);
  assert (joint.mJointType != JointTypeUndefined);

  if (joint.mJointType == JointTypeFixed) {
    previously_added_body_id = AddBodyFixedJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);

    return previously_added_body_id;
  } else if ( (joint.mJointType == JointTypeSpherical)
      || (joint.mJointType == JointTypeEulerZYX) 
      || (joint.mJointType == JointTypeEulerXYZ) 
      || (joint.mJointType == JointTypeEulerYXZ) 
      || (joint.mJointType == JointTypeEulerZXY) 
      || (joint.mJointType == JointTypeTranslationXYZ) 
      || (joint.mJointType == JointTypeCustom) 
      ) {
    // no action required
  } else if (joint.mJointType != JointTypePrismatic
             && joint.mJointType != JointTypeRevolute
             && joint.mJointType != JointTypeRevoluteX
             && joint.mJointType != JointTypeRevoluteY
             && joint.mJointType != JointTypeRevoluteZ
             && joint.mJointType != JointTypeHelical
            ) {
    previously_added_body_id = AddBodyMultiDofJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);
    return previously_added_body_id;
  }

  // If we add the body to a fixed body we have to make sure that we
  // actually add it to its movable parent.
  unsigned int movable_parent_id = parent_id;
  SpatialTransform movable_parent_transform;

  if (IsFixedBodyId(parent_id)) {
    unsigned int fbody_id = parent_id - fixed_body_discriminator;
    movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
    movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
  }

  // structural information
  lambda.push_back(movable_parent_id);
  unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;

  if (mJoints[mJoints.size() - 1].mDoFCount > 0
      && mJoints[mJoints.size() - 1].mJointType != JointTypeCustom) {
    lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
  } else if (mJoints[mJoints.size() - 1].mJointType == JointTypeCustom) {
    unsigned int custom_index = mJoints[mJoints.size() - 1].custom_joint_index;
    lambda_q_last = lambda_q_last
                    + mCustomJoints[mCustomJoints.size() - 1]->mDoFCount;
  }

  for (unsigned int i = 0; i < joint.mDoFCount; i++) {
    lambda_q.push_back(lambda_q_last + i);
  }
  mu.push_back(std::vector<unsigned int>());
  mu.at(movable_parent_id).push_back(mBodies.size());

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());
  mBodies.push_back(body);

  if (body_name.size() != 0) {
    if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    mBodyNameMap[body_name] = mBodies.size() - 1;
  }

  // state information
  v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  // Joints
  unsigned int prev_joint_index = mJoints.size() - 1;
  mJoints.push_back(joint);

  if (mJoints[prev_joint_index].mJointType != JointTypeCustom) {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  } else {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  }

  S.push_back (joint.mJointAxes[0]);

  // Joint state variables
  v_J.push_back (joint.mJointAxes[0]);
  c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  // workspace for joints with 3 dof
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  dof_count = dof_count + joint.mDoFCount;

  // update the w components of the Quaternions. They are stored at the end
  // of the q vector
  int multdof3_joint_counter = 0;
  int mCustomJoint_joint_counter = 0;
  for (unsigned int i = 1; i < mJoints.size(); i++) {
    if (mJoints[i].mJointType == JointTypeSpherical) {
      multdof3_w_index[i] = dof_count + multdof3_joint_counter;
      multdof3_joint_counter++;
    }
  }

  q_size = dof_count
           + multdof3_joint_counter;

  qdot_size = qdot_size + joint.mDoFCount;

  // we have to invert the transformation as it is later always used from the
  // child bodies perspective.
  X_T.push_back(joint_frame * movable_parent_transform);

  // Dynamic variables
  c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  IA.push_back(SpatialMatrix::Zero());
  pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  d = VectorNd::Zero (mBodies.size());
  u = VectorNd::Zero (mBodies.size());

  f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

  SpatialRigidBodyInertia rbi =
    SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass,
        body.mCenterOfMass,
        body.mInertia);

  Ic.push_back (rbi);
  I.push_back (rbi);
  hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));
  hdotc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  if (mBodies.size() == fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg << "Error: cannot add more than "
             << fixed_body_discriminator
             <<  " movable bodies. You need to modify Model::fixed_body_discriminator for this."
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  previously_added_body_id = mBodies.size() - 1;

  mJointUpdateOrder.clear();

  // update the joint order computation
  std::vector<std::pair<JointType, unsigned int> > joint_types;
  for (unsigned int i = 0; i < mJoints.size(); i++) {
    joint_types.push_back(
      std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
    mJointUpdateOrder.push_back (mJoints[i].mJointType);
  }

  mJointUpdateOrder.clear();
  JointType current_joint_type = JointTypeUndefined;
  while (joint_types.size() != 0) {
    current_joint_type = joint_types[0].first;

    std::vector<std::pair<JointType, unsigned int> >::iterator type_iter =
      joint_types.begin();

    while (type_iter != joint_types.end()) {
      if (type_iter->first == current_joint_type) {
        mJointUpdateOrder.push_back (type_iter->second);
        type_iter = joint_types.erase (type_iter);
      } else {
        ++type_iter;
      }
    }
  }

  //  for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
  //    std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i]
  // << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
  //  }

  return previously_added_body_id;
}